

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  uv_loop_s **buf;
  int iVar1;
  uv__work *ptr;
  iovec *piVar2;
  _func_void_uv__work_ptr_int *p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  bool bVar7;
  __mode_t __mode;
  uint uVar8;
  uv_dirent_type_t uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint *puVar14;
  ssize_t sVar15;
  size_t sVar16;
  _func_void_uv__work_ptr *__buf;
  dirent *dent;
  char *pcVar17;
  ulong uVar18;
  _func_void_uv__work_ptr *p_Var19;
  DIR *pDVar20;
  size_t sVar21;
  uv_loop_s *puVar22;
  uint uVar23;
  _func_void_uv__work_ptr_int *p_Var24;
  long lVar25;
  ulong uVar26;
  iovec *iov;
  code *pcVar27;
  size_t sVar28;
  size_t sVar29;
  uint uVar30;
  _func_void_uv__work_ptr_int *p_Var31;
  _func_void_uv__work_ptr_int *p_Var32;
  long lVar33;
  pollfd pfd;
  stat pbuf;
  _func_void_uv__work_ptr_int *local_20d0;
  stat local_20c8;
  undefined1 local_2038 [16];
  void *local_2028;
  undefined8 local_2020;
  __gid_t _Stack_2018;
  uv_loop_s *local_2010;
  void *local_2008;
  _func_void_uv__work_ptr *p_Stack_2000;
  uv_fs_type local_1ff8;
  undefined4 uStack_1ff4;
  uv_loop_t *local_1ff0;
  uv_fs_cb p_Stack_1fe8;
  _func_void_uv__work_ptr_int *local_1fe0;
  uv_loop_s *puStack_1fd8;
  _func_void_uv__work_ptr *local_1fd0;
  _func_void_uv__work_ptr_int *p_Stack_1fc8;
  char *local_1f28;
  int local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  _func_void_uv__work_ptr_int *local_1f08;
  uv__work local_1ee8;
  size_t local_1eb8;
  
  iVar1 = *(int *)&w[-7].done;
  puVar14 = (uint *)__errno_location();
  buf = &w[-6].loop;
LAB_004cc541:
  *puVar14 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    if (uv__fs_open_no_cloexec_support != '\0') {
LAB_004cc5a4:
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar10 = open((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1));
      if (-1 < iVar10) {
        iVar11 = uv__cloexec_ioctl(iVar10,1);
        if (iVar11 != 0) {
          iVar11 = uv__close(iVar10);
          iVar10 = -1;
          if (iVar11 != 0) {
switchD_004cc567_default:
            abort();
          }
        }
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
LAB_004cd1e8:
      p_Var31 = (_func_void_uv__work_ptr_int *)(long)iVar10;
      goto LAB_004ccf9d;
    }
    uVar30 = open((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                  (ulong)*(uint *)(w[-2].wq + 1));
    if ((int)uVar30 < 0) {
      if (*puVar14 != 0x16) break;
      uv__fs_open_no_cloexec_support = '\x01';
      goto LAB_004cc5a4;
    }
    p_Var31 = (_func_void_uv__work_ptr_int *)(ulong)uVar30;
    goto LAB_004cd54e;
  case 2:
    uVar30 = uv__close_nocancel(*(int *)w[-2].wq);
    if (uVar30 == 0xffffffff) {
      uVar30 = -(uint)(*puVar14 != 0x73 && *puVar14 != 4);
    }
    break;
  case 3:
    uVar8 = uv__getiovmax();
    uVar30 = *(uint *)((long)w[-2].wq + 0xc);
    if (uVar8 < uVar30) {
      *(uint *)((long)w[-2].wq + 0xc) = uVar8;
      uVar30 = uVar8;
    }
    p_Var31 = w[-1].done;
    if ((long)p_Var31 < 0) {
      piVar2 = (iovec *)w[-1].work;
      if (uVar30 == 1) {
        p_Var31 = (_func_void_uv__work_ptr_int *)
                  read(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
      }
      else {
        p_Var31 = (_func_void_uv__work_ptr_int *)readv(*(int *)w[-2].wq,piVar2,uVar30);
      }
    }
    else {
      if ((uVar30 != 1) && (uv__fs_read_no_preadv != '\x01')) {
        p_Var31 = (_func_void_uv__work_ptr_int *)
                  uv__preadv(*(int *)w[-2].wq,(iovec *)w[-1].work,uVar30,(int64_t)p_Var31);
        if ((p_Var31 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) ||
           (p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, *puVar14 != 0x26))
        goto LAB_004cd3d8;
        uv__fs_read_no_preadv = '\x01';
        p_Var31 = w[-1].done;
      }
      p_Var31 = (_func_void_uv__work_ptr_int *)
                pread(*(int *)w[-2].wq,*(void **)w[-1].work,*(size_t *)(w[-1].work + 8),
                      (__off_t)p_Var31);
    }
LAB_004cd3d8:
    if ((uv__work *)w[-1].work != w + 1) {
      uv__free((uv__work *)w[-1].work);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_004ccf9d;
  case 4:
    uVar8 = uv__getiovmax();
    uVar30 = *(uint *)((long)w[-2].wq + 0xc);
    ptr = (uv__work *)w[-1].work;
    if (uVar30 != 0) {
      p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
LAB_004cc8a2:
      uVar23 = uVar8;
      if (uVar30 < uVar8) {
        uVar23 = uVar30;
      }
      *(uint *)((long)w[-2].wq + 0xc) = uVar23;
      do {
        p_Var32 = w[-1].done;
        if ((long)p_Var32 < 0) {
          piVar2 = (iovec *)w[-1].work;
          if (uVar23 == 1) {
            p_Var32 = (_func_void_uv__work_ptr_int *)
                      write(*(int *)w[-2].wq,piVar2->iov_base,piVar2->iov_len);
          }
          else {
            p_Var32 = (_func_void_uv__work_ptr_int *)writev(*(int *)w[-2].wq,piVar2,uVar23);
          }
LAB_004cc910:
          if (-1 < (long)p_Var32) goto LAB_004cc951;
          uVar23 = *puVar14;
        }
        else {
          iov = (iovec *)w[-1].work;
          if ((uVar23 == 1) || (uv__fs_write_no_pwritev == '\x01')) {
LAB_004cc8ca:
            p_Var32 = (_func_void_uv__work_ptr_int *)
                      pwrite(*(int *)w[-2].wq,iov->iov_base,iov->iov_len,(__off_t)p_Var32);
            goto LAB_004cc910;
          }
          p_Var32 = (_func_void_uv__work_ptr_int *)
                    uv__pwritev(*(int *)w[-2].wq,iov,uVar23,(int64_t)p_Var32);
          if (p_Var32 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_004cc910;
          uVar23 = *puVar14;
          p_Var32 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
          if (uVar23 == 0x26) {
            uv__fs_write_no_pwritev = '\x01';
            iov = (iovec *)w[-1].work;
            p_Var32 = w[-1].done;
            goto LAB_004cc8ca;
          }
        }
        if (uVar23 != 4) goto LAB_004cd48f;
        uVar23 = *(uint *)((long)w[-2].wq + 0xc);
      } while( true );
    }
    p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
LAB_004cd496:
    if (ptr != w + 1) {
      uv__free(ptr);
    }
    w[-1].work = (_func_void_uv__work_ptr *)0x0;
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    goto LAB_004ccf9d;
  case 5:
    local_20d0 = w[-1].done;
    sVar15 = sendfile(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(off_t *)&local_20d0,
                      (size_t)w[1].done);
    p_Var32 = w[-1].done;
    if ((local_20d0 + -(long)p_Var32 == (_func_void_uv__work_ptr_int *)0x0 ||
        (long)local_20d0 < (long)p_Var32) && sVar15 == -1) {
      uVar30 = *puVar14;
      if (((uVar30 < 0x17) && ((0x440020U >> (uVar30 & 0x1f) & 1) != 0)) ||
         (p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff, uVar30 == 0x58)) {
        *puVar14 = 0;
        p_Var31 = w[1].done;
        if (p_Var31 != (_func_void_uv__work_ptr_int *)0x0) {
          iVar10 = *(int *)w[-2].wq;
          iVar11 = *(int *)((long)w[-2].wq + 4);
          bVar7 = true;
          p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
LAB_004cd02a:
          do {
            sVar28 = (long)p_Var31 - (long)p_Var24;
            if (0x1fff < sVar28) {
              sVar28 = 0x2000;
            }
LAB_004cd041:
            if (bVar7) {
              sVar21 = pread(iVar11,local_2038,sVar28,(__off_t)p_Var32);
            }
            else {
              sVar21 = read(iVar11,local_2038,sVar28);
            }
            if (sVar21 == 0xffffffffffffffff) goto code_r0x004cd06b;
            if (sVar21 == 0) goto LAB_004cd43c;
            if (0 < (long)sVar21) {
              lVar25 = 0;
              sVar28 = sVar21;
              do {
                while( true ) {
                  sVar15 = write(iVar10,local_2038 + lVar25,sVar28);
                  if (sVar15 != -1) break;
                  if (*puVar14 != 4) {
                    if (*puVar14 != 0xb) goto LAB_004cd4d0;
                    local_20c8.st_dev._4_4_ = 4;
                    local_20c8.st_dev._0_4_ = iVar10;
                    while( true ) {
                      iVar12 = poll((pollfd *)&local_20c8,1,-1);
                      if (iVar12 != -1) break;
                      if (*puVar14 != 4) goto LAB_004cd458;
                    }
                    if ((local_20c8.st_dev._4_4_ & 0xfffb0000) != 0) {
LAB_004cd458:
                      *puVar14 = 5;
                      p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
                      goto LAB_004ccf9d;
                    }
                  }
                }
                lVar25 = lVar25 + sVar15;
                sVar28 = sVar21 - lVar25;
              } while (sVar28 != 0 && lVar25 <= (long)sVar21);
            }
            p_Var32 = p_Var32 + sVar21;
            p_Var24 = p_Var24 + sVar21;
            if (p_Var31 <= p_Var24) {
LAB_004cd43c:
              if (p_Var24 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_004cd447;
              p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
              goto LAB_004ccf9d;
            }
          } while( true );
        }
        p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
LAB_004cd447:
        w[-1].done = p_Var32;
        p_Var31 = p_Var24;
      }
    }
    else {
      w[-1].done = local_20d0;
      p_Var31 = local_20d0 + -(long)p_Var32;
    }
    goto LAB_004ccf9d;
  case 6:
    p_Var31 = w[-6].done;
    uVar30 = uv__fs_statx(-1,(char *)p_Var31,0,0,(uv_stat_t *)buf);
    if (uVar30 == 0xffffffda) {
      uVar30 = stat((char *)p_Var31,(stat *)local_2038);
LAB_004ccc84:
      if (uVar30 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        auVar5._8_4_ = _Stack_2018;
        auVar5._0_8_ = (ulong)local_2020 >> 0x20;
        auVar5._12_4_ = 0;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)auVar5._8_8_;
        w[-5].loop = local_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = p_Stack_2000;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-2].work = local_1fd0;
        w[-2].done = p_Stack_1fc8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = p_Stack_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
        uVar30 = 0;
      }
    }
    break;
  case 7:
    p_Var31 = w[-6].done;
    uVar30 = uv__fs_statx(-1,(char *)p_Var31,0,1,(uv_stat_t *)buf);
    if (uVar30 == 0xffffffda) {
      uVar30 = lstat((char *)p_Var31,(stat *)local_2038);
      goto LAB_004ccc84;
    }
    break;
  case 8:
    iVar10 = *(int *)w[-2].wq;
    uVar30 = uv__fs_statx(iVar10,"",1,0,(uv_stat_t *)buf);
    if (uVar30 == 0xffffffda) {
      uVar30 = fstat(iVar10,(stat *)local_2038);
      if (uVar30 == 0) {
        w[-6].loop = (uv_loop_s *)local_2038._0_8_;
        w[-6].wq[0] = (void *)((ulong)local_2020 & 0xffffffff);
        w[-6].wq[1] = local_2028;
        auVar4._8_4_ = _Stack_2018;
        auVar4._0_8_ = (ulong)local_2020 >> 0x20;
        auVar4._12_4_ = 0;
        w[-5].work = (_func_void_uv__work_ptr *)((ulong)local_2020 >> 0x20);
        w[-5].done = (_func_void_uv__work_ptr_int *)auVar4._8_8_;
        w[-5].loop = local_2010;
        w[-5].wq[0] = (void *)local_2038._8_8_;
        w[-5].wq[1] = local_2008;
        w[-4].work = p_Stack_2000;
        w[-4].done = (_func_void_uv__work_ptr_int *)CONCAT44(uStack_1ff4,local_1ff8);
        w[-4].wq[1] = local_1ff0;
        w[-3].work = (_func_void_uv__work_ptr *)p_Stack_1fe8;
        w[-3].done = local_1fe0;
        w[-3].loop = puStack_1fd8;
        w[-2].work = local_1fd0;
        w[-2].done = p_Stack_1fc8;
        w[-3].wq[0] = local_1fd0;
        w[-3].wq[1] = p_Stack_1fc8;
        w[-4].loop = (uv_loop_s *)0x0;
        w[-4].wq[0] = (void *)0x0;
        uVar30 = 0;
      }
    }
    break;
  case 9:
    uVar30 = ftruncate(*(int *)w[-2].wq,(__off_t)w[-1].done);
    break;
  case 10:
    local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
    dVar6 = (double)w[-1].wq[0] * 1000000.0;
    uVar18 = (ulong)dVar6;
    local_2038._8_8_ =
         (((long)(dVar6 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) % 1000000) * 1000;
    local_2028 = (void *)(long)(double)w[-1].wq[1];
    dVar6 = (double)w[-1].wq[1] * 1000000.0;
    uVar18 = (ulong)dVar6;
    local_2020 = (void *)((((long)(dVar6 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) %
                          1000000) * 1000);
    uVar30 = utimensat(-100,(char *)w[-6].done,(timespec *)local_2038,0);
    break;
  case 0xb:
    local_2038._0_8_ = (undefined8)(double)w[-1].wq[0];
    dVar6 = (double)w[-1].wq[0] * 1000000.0;
    uVar18 = (ulong)dVar6;
    local_2038._8_8_ =
         (((long)(dVar6 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) % 1000000) * 1000;
    local_2028 = (void *)(long)(double)w[-1].wq[1];
    dVar6 = (double)w[-1].wq[1] * 1000000.0;
    uVar18 = (ulong)dVar6;
    local_2020 = (void *)((((long)(dVar6 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18) %
                          1000000) * 1000);
    uVar30 = futimens(*(int *)w[-2].wq,(timespec *)local_2038);
    break;
  case 0xc:
    uVar30 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    uVar30 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    uVar30 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    uVar30 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    uVar30 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    uVar30 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    uVar30 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    uVar30 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar17 = mkdtemp((char *)w[-6].done);
    p_Var31 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar17 == (char *)0x0);
    goto LAB_004ccf9d;
  case 0x15:
    uVar30 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    local_2038._0_8_ = (uv_loop_s *)0x0;
    iVar10 = scandir((char *)w[-6].done,(dirent ***)local_2038,uv__fs_scandir_filter,
                     uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (iVar10 != -1) {
      puVar22 = (uv_loop_s *)local_2038._0_8_;
      if (iVar10 == 0) {
        free((void *)local_2038._0_8_);
        puVar22 = (uv_loop_s *)0x0;
      }
      w[-6].work = (_func_void_uv__work_ptr *)puVar22;
      goto LAB_004cd1e8;
    }
    p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_004ccf9d;
  case 0x17:
    uVar30 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    uVar30 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar16 = pathconf((char *)w[-6].done,4);
    sVar29 = 0x100;
    if (sVar16 != 0xffffffffffffffff) {
      sVar29 = sVar16;
    }
    __buf = (_func_void_uv__work_ptr *)uv__malloc(sVar29);
    if (__buf == (_func_void_uv__work_ptr *)0x0) {
      *puVar14 = 0xc;
    }
    else {
      sVar16 = readlink((char *)w[-6].done,(char *)__buf,sVar29);
      if (sVar16 != 0xffffffffffffffff) {
        p_Var19 = __buf;
        if (sVar16 == sVar29) {
          p_Var19 = (_func_void_uv__work_ptr *)uv__realloc(__buf,sVar29 + 1);
          sVar16 = sVar29;
          if (p_Var19 == (_func_void_uv__work_ptr *)0x0) goto LAB_004cc824;
        }
        p_Var19[sVar16] = (_func_void_uv__work_ptr)0x0;
        goto LAB_004cd58e;
      }
LAB_004cc824:
      uv__free(__buf);
    }
    goto LAB_004ccfa7;
  case 0x1a:
    uVar30 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    uVar30 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    p_Var19 = (_func_void_uv__work_ptr *)realpath((char *)w[-6].done,(char *)0x0);
    if (p_Var19 != (_func_void_uv__work_ptr *)0x0) goto LAB_004cd58e;
    goto LAB_004ccfa7;
  case 0x1d:
    iVar10 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].done,0,0,(uv_fs_cb)0x0)
    ;
    uv_fs_req_cleanup((uv_fs_t *)local_2038);
    if (iVar10 < 0) {
      p_Var31 = (_func_void_uv__work_ptr_int *)(long)iVar10;
    }
    else {
      iVar11 = fstat(iVar10,&local_20c8);
      __mode = local_20c8.st_mode;
      iVar12 = -1;
      if (iVar11 == 0) {
        iVar12 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,
                            (*(uint *)((long)w[-2].wq + 4) & 1) << 7 | 0x241,local_20c8.st_mode,
                            (uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
        iVar11 = iVar12;
        if (-1 < iVar12) {
          iVar11 = fchmod(iVar12,__mode);
          if (iVar11 == -1) goto LAB_004ccf03;
          if (((ulong)w[-2].wq[0] & 0x600000000) == 0) {
LAB_004cd2eb:
            if (local_20c8.st_size == 0) {
              iVar11 = 0;
            }
            else {
              p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
              sVar29 = local_20c8.st_size;
              do {
                local_2038._8_4_ = 6;
                local_1ff8 = UV_FS_SENDFILE;
                local_1f28 = (char *)0x0;
                local_1f10 = (uv_buf_t *)0x0;
                local_1fd0 = (_func_void_uv__work_ptr *)0x0;
                local_1fe0 = (_func_void_uv__work_ptr_int *)0x0;
                puStack_1fd8 = (uv_loop_s *)0x0;
                local_1ff0 = (uv_loop_t *)0x0;
                p_Stack_1fe8 = (uv_fs_cb)0x0;
                local_1f20 = iVar12;
                local_1f1c = iVar10;
                local_1f08 = p_Var31;
                local_1eb8 = sVar29;
                uv__fs_work(&local_1ee8);
                iVar11 = (int)local_1fe0;
                uv_fs_req_cleanup((uv_fs_t *)local_2038);
                if (iVar11 < 0) goto LAB_004ccf13;
                p_Var31 = p_Var31 + (long)local_1fe0;
                sVar29 = sVar29 - (long)local_1fe0;
              } while (sVar29 != 0);
              iVar11 = 0;
            }
          }
          else {
            iVar13 = ioctl(iVar12,0x40049409,iVar10);
            iVar11 = 0;
            if (iVar13 == -1) {
              uVar30 = *puVar14;
              if (((uVar30 != 0x12) && (uVar30 != 0x5f)) && (uVar30 != 0x19)) goto LAB_004ccf06;
              iVar11 = -0x5f;
              if (((ulong)w[-2].wq[0] & 0x400000000) == 0) goto LAB_004cd2eb;
            }
          }
        }
      }
      else {
LAB_004ccf03:
        uVar30 = *puVar14;
LAB_004ccf06:
        iVar11 = 0;
        if (0 < (int)uVar30) {
          iVar11 = -uVar30;
        }
      }
LAB_004ccf13:
      iVar10 = uv__close_nocheckstdio(iVar10);
      if (iVar10 == 0) {
        iVar10 = iVar11;
      }
      if (iVar11 != 0) {
        iVar10 = iVar11;
      }
      if (iVar12 < 0) {
        if (iVar10 == 0) goto LAB_004cd3c8;
      }
      else {
        iVar11 = uv__close_nocheckstdio(iVar12);
        if (iVar11 == 0) {
          iVar11 = iVar10;
        }
        if (iVar10 == 0) {
          iVar10 = iVar11;
        }
        if (iVar10 == 0) {
LAB_004cd3c8:
          p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
          goto LAB_004ccf9d;
        }
        uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].loop,(uv_fs_cb)0x0);
        uv_fs_req_cleanup((uv_fs_t *)local_2038);
      }
      *puVar14 = -iVar10;
      p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    }
    goto LAB_004ccf9d;
  case 0x1e:
    uVar30 = lchown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1f:
    p_Var19 = (_func_void_uv__work_ptr *)uv__malloc(0x38);
    if (p_Var19 == (_func_void_uv__work_ptr *)0x0) {
LAB_004ccfc2:
      uv__free(p_Var19);
      p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
      p_Var19 = (_func_void_uv__work_ptr *)0x0;
    }
    else {
      pDVar20 = opendir((char *)w[-6].done);
      *(DIR **)(p_Var19 + 0x30) = pDVar20;
      if (pDVar20 == (DIR *)0x0) goto LAB_004ccfc2;
      p_Var31 = (_func_void_uv__work_ptr_int *)0x0;
    }
    w[-6].work = p_Var19;
    goto LAB_004ccf9d;
  case 0x20:
    p_Var19 = w[-6].work;
    if (*(long *)(p_Var19 + 8) != 0) {
      uVar26 = 0;
      uVar18 = 0;
LAB_004ccaf4:
      do {
        *puVar14 = 0;
        dent = readdir(*(DIR **)(p_Var19 + 0x30));
        uVar30 = (uint)uVar18;
        if (dent == (dirent *)0x0) {
          if (*puVar14 != 0) {
LAB_004cd1fa:
            if (uVar30 != 0) {
              lVar25 = *(long *)p_Var19;
              lVar33 = 0;
              do {
                uv__free(*(void **)(lVar25 + lVar33));
                lVar25 = *(long *)p_Var19;
                *(undefined8 *)(lVar25 + lVar33) = 0;
                lVar33 = lVar33 + 0x10;
              } while (uVar18 << 4 != lVar33);
            }
            uVar30 = 0xffffffff;
          }
          break;
        }
        if ((dent->d_name[0] == '.') &&
           ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0'))))))
        goto LAB_004ccb30;
        lVar25 = *(long *)p_Var19;
        pcVar17 = uv__strdup(dent->d_name);
        *(char **)(lVar25 + uVar26 * 0x10) = pcVar17;
        if (pcVar17 == (char *)0x0) goto LAB_004cd1fa;
        uVar9 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
        *(uv_dirent_type_t *)(lVar25 + uVar26 * 0x10 + 8) = uVar9;
        uVar30 = uVar30 + 1;
        uVar26 = (ulong)uVar30;
        uVar18 = uVar26;
      } while (uVar26 < *(ulong *)(p_Var19 + 8));
      goto LAB_004cd236;
    }
    uVar30 = 0;
LAB_004cd236:
    p_Var31 = (_func_void_uv__work_ptr_int *)(long)(int)uVar30;
    goto LAB_004ccf9d;
  case 0x21:
    p_Var19 = w[-6].work;
    if (*(DIR **)(p_Var19 + 0x30) != (DIR *)0x0) {
      closedir(*(DIR **)(p_Var19 + 0x30));
      *(undefined8 *)(p_Var19 + 0x30) = 0;
      p_Var19 = w[-6].work;
    }
    uv__free(p_Var19);
    p_Var19 = (_func_void_uv__work_ptr *)0x0;
LAB_004cd58e:
    w[-6].work = p_Var19;
    w[-7].wq[1] = (void *)0x0;
    goto LAB_004cd55a;
  default:
    goto switchD_004cc567_default;
  }
  p_Var31 = (_func_void_uv__work_ptr_int *)(long)(int)uVar30;
  goto LAB_004ccf9d;
LAB_004ccb30:
  if (*(ulong *)(p_Var19 + 8) <= uVar26) goto LAB_004cd236;
  goto LAB_004ccaf4;
code_r0x004cd06b:
  uVar30 = *puVar14;
  if (uVar30 != 4) goto code_r0x004cd077;
  goto LAB_004cd041;
code_r0x004cd077:
  if ((!bVar7) || (p_Var24 != (_func_void_uv__work_ptr_int *)0x0)) {
    p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    if (p_Var24 + 1 < (code *)0x2) goto LAB_004ccf9d;
    goto LAB_004cd447;
  }
  bVar7 = false;
  p_Var24 = (_func_void_uv__work_ptr_int *)0x0;
  if ((uVar30 == 5) || (p_Var24 = (_func_void_uv__work_ptr_int *)0x0, uVar30 == 0x1d))
  goto LAB_004cd02a;
LAB_004cd4d0:
  p_Var31 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
LAB_004ccf9d:
  if (p_Var31 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
LAB_004cd54e:
    w[-7].wq[1] = p_Var31;
    if (p_Var31 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_004cd55a:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)buf;
    return;
  }
LAB_004ccfa7:
  if ((0xfffffffd < iVar1 - 4U) || (*puVar14 != 4)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar14;
    return;
  }
  goto LAB_004cc541;
LAB_004cc951:
  if (p_Var32 == (_func_void_uv__work_ptr_int *)0x0) {
    p_Var32 = (_func_void_uv__work_ptr_int *)0x0;
LAB_004cd48f:
    if (p_Var31 == (_func_void_uv__work_ptr_int *)0x0) {
      p_Var31 = p_Var32;
    }
    goto LAB_004cd496;
  }
  if (-1 < (long)w[-1].done) {
    w[-1].done = w[-1].done + (long)p_Var32;
  }
  p_Var19 = w[-1].work;
  pcVar27 = p_Var19 + 8;
  uVar23 = 0;
  p_Var24 = p_Var32;
  do {
    p_Var3 = *(_func_void_uv__work_ptr_int **)pcVar27;
    if (p_Var24 <= p_Var3 && (long)p_Var3 - (long)p_Var24 != 0) {
      *(_func_void_uv__work_ptr_int **)(pcVar27 + -8) = p_Var24 + *(ulong *)(pcVar27 + -8);
      *(long *)pcVar27 = (long)p_Var3 - (long)p_Var24;
      break;
    }
    uVar23 = uVar23 + 1;
    pcVar27 = pcVar27 + 0x10;
    p_Var24 = p_Var24 + -(long)p_Var3;
  } while (p_Var24 != (_func_void_uv__work_ptr_int *)0x0);
  *(uint *)((long)w[-2].wq + 0xc) = uVar23;
  w[-1].work = p_Var19 + (ulong)uVar23 * 0x10;
  p_Var31 = p_Var31 + (long)p_Var32;
  uVar30 = uVar30 - uVar23;
  if (uVar30 == 0) goto LAB_004cd496;
  goto LAB_004cc8a2;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}